

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_lqarx(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 retval;
  TCGv_i64 ret;
  TCGv_i64 EA;
  TCGv_i32 ret_00;
  TCGv_i64 val;
  MemOp_conflict memop;
  uint uVar3;
  
  uVar1 = ctx->opcode;
  if ((((uVar1 >> 0x15 & 1) == 0) && (uVar3 = uVar1 >> 0x15 & 0x1f, uVar3 != (uVar1 >> 0x10 & 0x1f))
      ) && (uVar3 != (uVar1 >> 0xb & 0x1f))) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x40);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    retval = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar3 * 8 | 8));
    ret = cpu_gpr[uVar3];
    if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
      if (ctx->le_mode == true) {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,retval,EA,(long)ctx->mem_idx,MO_ALIGN_16|MO_64);
        tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_reserve,EA);
        gen_addr_add(ctx,EA,EA,8);
        iVar2 = ctx->mem_idx;
        memop = MO_64;
        val = ret;
      }
      else {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,ret,EA,(long)ctx->mem_idx,MO_ALIGN_16|MO_BEQ);
        tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_reserve,EA);
        gen_addr_add(ctx,EA,EA,8);
        iVar2 = ctx->mem_idx;
        memop = MO_BEQ;
        val = retval;
      }
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val,EA,(long)iVar2,memop);
    }
    else {
      ret_00 = tcg_temp_new_i32(tcg_ctx);
      if (ctx->le_mode == true) {
        tcg_gen_movi_i32(tcg_ctx,ret_00,ctx->mem_idx | 0x430);
        gen_helper_lq_le_parallel(tcg_ctx,retval,tcg_ctx->cpu_env,EA,ret_00);
      }
      else {
        tcg_gen_movi_i32(tcg_ctx,ret_00,ctx->mem_idx | 0x4b0);
        gen_helper_lq_be_parallel(tcg_ctx,retval,tcg_ctx->cpu_env,EA,ret_00);
      }
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
      tcg_gen_ld_i64_ppc64(tcg_ctx,ret,tcg_ctx->cpu_env,0x2b0);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_gen_st_i64_ppc64(tcg_ctx,ret,tcg_ctx->cpu_env,0x270);
    tcg_gen_st_i64_ppc64(tcg_ctx,retval,tcg_ctx->cpu_env,0x278);
    return;
  }
  gen_inval_exception(ctx,1);
  return;
}

Assistant:

static void gen_lqarx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv EA, hi, lo;

    if (unlikely((rd & 1) || (rd == rA(ctx->opcode)) ||
                 (rd == rB(ctx->opcode)))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }

    gen_set_access_type(ctx, ACCESS_RES);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);

    /* Note that the low part is always in RD+1, even in LE mode.  */
    lo = cpu_gpr[rd + 1];
    hi = cpu_gpr[rd];

    if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
        if (HAVE_ATOMIC128) {
            TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
            if (ctx->le_mode) {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_le_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            } else {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_be_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            }
            tcg_temp_free_i32(tcg_ctx, oi);
            tcg_gen_ld_i64(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, retxh));
        } else {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
            tcg_temp_free(tcg_ctx, EA);
            return;
        }
    } else if (ctx->le_mode) {
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
    }
    tcg_temp_free(tcg_ctx, EA);

    tcg_gen_st_tl(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val));
    tcg_gen_st_tl(tcg_ctx, lo, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val2));
}